

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O3

qlonglong __thiscall QString::toIntegral_helper(QString *this,QStringView string,bool *ok,int base)

{
  QLocaleData *__size;
  uchar *dst;
  int base_00;
  QLocaleData *allocSize_00;
  size_t allocSize;
  long in_FS_OFFSET;
  QByteArrayView num;
  QSimpleParsedNumber<long_long> QVar1;
  uchar local_150 [256];
  QLocaleData *local_50;
  QLocaleData *local_48;
  uchar *local_40;
  long local_38;
  
  base_00 = (int)ok;
  allocSize_00 = (QLocaleData *)string.m_data;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  dst = local_150;
  memset(dst,0xaa,0x100);
  local_50 = (QLocaleData *)0x100;
  local_48 = (QLocaleData *)0x0;
  if (0x100 < (long)allocSize_00) {
    local_50 = allocSize_00;
    local_40 = dst;
    __size = (QLocaleData *)QtPrivate::expectedAllocSize((size_t)allocSize_00,0x10);
    if (__size == (QLocaleData *)0x0) {
      __size = allocSize_00;
    }
    dst = (uchar *)malloc((size_t)__size);
    local_50 = __size;
  }
  local_48 = allocSize_00;
  local_40 = dst;
  qt_to_latin1(dst,(char16_t *)this,(qsizetype)allocSize_00);
  num.m_data = (storage_type *)((ulong)ok & 0xffffffff);
  num.m_size = (qsizetype)local_40;
  QVar1 = QLocaleData::bytearrayToLongLong(local_48,num,base_00);
  if (string.m_size != 0) {
    *(bool *)string.m_size = 0 < QVar1.used;
  }
  if (local_40 != local_150) {
    QtPrivate::sizedFree(local_40,(size_t)local_50);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return QVar1.result;
  }
  __stack_chk_fail();
}

Assistant:

qlonglong QString::toIntegral_helper(QStringView string, bool *ok, int base)
{
    return toIntegral<qlonglong>(string, ok, base);
}